

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateExtension(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  char *pcVar2;
  spv_parsed_instruction_t *in_RDX;
  string extension;
  DiagnosticStream local_1f8;
  
  if (0x103ff < _->version_) {
    return SPV_SUCCESS;
  }
  GetExtensionString_abi_cxx11_(&extension,(spvtools *)&inst->inst_,in_RDX);
  pcVar2 = ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout);
  bVar1 = std::operator==(&extension,pcVar2);
  if (!bVar1) {
    pcVar2 = ExtensionToString(kSPV_EXT_mesh_shader);
    bVar1 = std::operator==(&extension,pcVar2);
    if (!bVar1) {
      pcVar2 = ExtensionToString(kSPV_NV_shader_invocation_reorder);
      bVar1 = std::operator==(&extension,pcVar2);
      if (!bVar1) {
        bVar1 = true;
        goto LAB_001b8cef;
      }
    }
  }
  ValidationState_t::diag(&local_1f8,_,SPV_ERROR_WRONG_VERSION,inst);
  std::operator<<((ostream *)&local_1f8,(string *)&extension);
  std::operator<<((ostream *)&local_1f8," extension requires SPIR-V version 1.4 or later.");
  inst = (Instruction *)(ulong)(uint)local_1f8.error_;
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  bVar1 = false;
LAB_001b8cef:
  std::__cxx11::string::_M_dispose();
  if (bVar1) {
    return SPV_SUCCESS;
  }
  return (spv_result_t)inst;
}

Assistant:

spv_result_t ValidateExtension(ValidationState_t& _, const Instruction* inst) {
  if (_.version() < SPV_SPIRV_VERSION_WORD(1, 4)) {
    std::string extension = GetExtensionString(&(inst->c_inst()));
    if (extension ==
            ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout) ||
        extension == ExtensionToString(kSPV_EXT_mesh_shader) ||
        extension == ExtensionToString(kSPV_NV_shader_invocation_reorder)) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << extension << " extension requires SPIR-V version 1.4 or later.";
    }
  }

  return SPV_SUCCESS;
}